

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeboneProcess.cpp
# Opt level: O0

bool __thiscall Assimp::DeboneProcess::ConsiderMesh(DeboneProcess *this,aiMesh *pMesh)

{
  uint uVar1;
  float fVar2;
  bool bVar3;
  reference pvVar4;
  float *pfVar5;
  Logger *this_00;
  reference rVar6;
  reference local_118;
  uint local_104;
  undefined1 auStack_100 [4];
  uint i_2;
  _Bit_type local_f8;
  reference local_f0;
  value_type local_e0;
  uint local_dc;
  uint w_1;
  uint j_1;
  uint v;
  uint i_1;
  _Bit_type local_c8;
  reference local_c0;
  reference local_b0;
  uint local_a0;
  float local_9c;
  uint vid;
  float w;
  uint j;
  uint i;
  uint cCoowned;
  uint cUnowned;
  undefined1 local_80 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> vertexBones;
  allocator<bool> local_52;
  bool local_51;
  undefined1 local_50 [8];
  vector<bool,_std::allocator<bool>_> isBoneNecessary;
  bool isInterstitialRequired;
  bool split;
  aiMesh *pMesh_local;
  DeboneProcess *this_local;
  
  bVar3 = aiMesh::HasBones(pMesh);
  if (bVar3) {
    isBoneNecessary.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage._7_1_ = 0;
    isBoneNecessary.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage._6_1_ = 0;
    uVar1 = pMesh->mNumBones;
    local_51 = false;
    std::allocator<bool>::allocator(&local_52);
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)local_50,(ulong)uVar1,&local_51,&local_52);
    std::allocator<bool>::~allocator(&local_52);
    uVar1 = pMesh->mNumVertices;
    cUnowned = 0xffffffff;
    std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)((long)&cCoowned + 3));
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_80,(ulong)uVar1,
               &cUnowned,(allocator<unsigned_int> *)((long)&cCoowned + 3));
    std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&cCoowned + 3));
    i = 0xffffffff;
    j = 0xfffffffe;
    w = 0.0;
    while( true ) {
      if (pMesh->mNumBones <= (uint)w) break;
      for (vid = 0; vid < pMesh->mBones[(uint)w]->mNumWeights; vid = vid + 1) {
        local_9c = pMesh->mBones[(uint)w]->mWeights[vid].mWeight;
        if ((local_9c != 0.0) || (NAN(local_9c))) {
          local_a0 = pMesh->mBones[(uint)w]->mWeights[vid].mVertexId;
          if (this->mThreshold <= local_9c) {
            pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_80,
                                (ulong)local_a0);
            fVar2 = w;
            if (*pvVar4 == 0xffffffff) {
              pfVar5 = (float *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                           local_80,(ulong)local_a0);
              *pfVar5 = fVar2;
            }
            else {
              pfVar5 = (float *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                           local_80,(ulong)local_a0);
              if (*pfVar5 == w) {
                this_00 = DefaultLogger::get();
                Logger::warn(this_00,"Encountered double entry in bone weights");
              }
              else {
                pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                   ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_80,
                                    (ulong)local_a0);
                *pvVar4 = 0xfffffffe;
              }
            }
          }
          rVar6 = std::vector<bool,_std::allocator<bool>_>::operator[]
                            ((vector<bool,_std::allocator<bool>_> *)local_50,(ulong)(uint)w);
          local_b0 = rVar6;
          bVar3 = std::_Bit_reference::operator_cast_to_bool(&local_b0);
          if (((bVar3 ^ 0xffU) & 1) != 0) {
            bVar3 = local_9c < this->mThreshold;
            rVar6 = std::vector<bool,_std::allocator<bool>_>::operator[]
                              ((vector<bool,_std::allocator<bool>_> *)local_50,(ulong)(uint)w);
            local_c0 = rVar6;
            std::_Bit_reference::operator=(&local_c0,bVar3);
          }
        }
      }
      rVar6 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)local_50,(ulong)(uint)w);
      _v = rVar6;
      bVar3 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&v);
      if (((bVar3 ^ 0xffU) & 1) != 0) {
        isBoneNecessary.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_end_of_storage._6_1_ = 1;
      }
      w = (float)((int)w + 1);
    }
    if ((isBoneNecessary.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
         ._M_end_of_storage._6_1_ & 1) != 0) {
      for (j_1 = 0; j_1 < pMesh->mNumFaces; j_1 = j_1 + 1) {
        pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_80,
                            (ulong)*pMesh->mFaces[j_1].mIndices);
        w_1 = *pvVar4;
        for (local_dc = 1; local_dc < pMesh->mFaces[j_1].mNumIndices; local_dc = local_dc + 1) {
          pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_80,
                              (ulong)pMesh->mFaces[j_1].mIndices[local_dc]);
          local_e0 = *pvVar4;
          if (w_1 != local_e0) {
            if (w_1 < pMesh->mNumBones) {
              rVar6 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                ((vector<bool,_std::allocator<bool>_> *)local_50,(ulong)w_1);
              local_f0 = rVar6;
              std::_Bit_reference::operator=(&local_f0,true);
            }
            if (local_e0 < pMesh->mNumBones) {
              rVar6 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                ((vector<bool,_std::allocator<bool>_> *)local_50,(ulong)local_e0);
              _auStack_100 = rVar6;
              std::_Bit_reference::operator=((_Bit_reference *)auStack_100,true);
            }
          }
        }
      }
    }
    for (local_104 = 0; local_104 < pMesh->mNumBones; local_104 = local_104 + 1) {
      rVar6 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)local_50,(ulong)local_104);
      local_118 = rVar6;
      bVar3 = std::_Bit_reference::operator_cast_to_bool(&local_118);
      if (((bVar3 ^ 0xffU) & 1) != 0) {
        this->mNumBonesCanDoWithout = this->mNumBonesCanDoWithout + 1;
        isBoneNecessary.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_end_of_storage._7_1_ = 1;
      }
      this->mNumBones = this->mNumBones + 1;
    }
    this_local._7_1_ =
         (bool)(isBoneNecessary.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_end_of_storage._7_1_ & 1);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_80);
    std::vector<bool,_std::allocator<bool>_>::~vector
              ((vector<bool,_std::allocator<bool>_> *)local_50);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool DeboneProcess::ConsiderMesh(const aiMesh* pMesh)
{
    if(!pMesh->HasBones()) {
        return false;
    }

    bool split = false;

    //interstitial faces not permitted
    bool isInterstitialRequired = false;

    std::vector<bool> isBoneNecessary(pMesh->mNumBones,false);
    std::vector<unsigned int> vertexBones(pMesh->mNumVertices,UINT_MAX);

    const unsigned int cUnowned = UINT_MAX;
    const unsigned int cCoowned = UINT_MAX-1;

    for(unsigned int i=0;i<pMesh->mNumBones;i++)    {
        for(unsigned int j=0;j<pMesh->mBones[i]->mNumWeights;j++)   {
            float w = pMesh->mBones[i]->mWeights[j].mWeight;

            if(w==0.0f) {
                continue;
            }

            unsigned int vid = pMesh->mBones[i]->mWeights[j].mVertexId;
            if(w>=mThreshold)   {

                if(vertexBones[vid]!=cUnowned)  {
                    if(vertexBones[vid]==i) //double entry
                    {
                        ASSIMP_LOG_WARN("Encountered double entry in bone weights");
                    }
                    else //TODO: track attraction in order to break tie
                    {
                        vertexBones[vid] = cCoowned;
                    }
                }
                else vertexBones[vid] = i;
            }

            if(!isBoneNecessary[i]) {
                isBoneNecessary[i] = w<mThreshold;
            }
        }

        if(!isBoneNecessary[i])  {
            isInterstitialRequired = true;
        }
    }

    if(isInterstitialRequired) {
        for(unsigned int i=0;i<pMesh->mNumFaces;i++) {
            unsigned int v = vertexBones[pMesh->mFaces[i].mIndices[0]];

            for(unsigned int j=1;j<pMesh->mFaces[i].mNumIndices;j++) {
                unsigned int w = vertexBones[pMesh->mFaces[i].mIndices[j]];

                if(v!=w)    {
                    if(v<pMesh->mNumBones) isBoneNecessary[v] = true;
                    if(w<pMesh->mNumBones) isBoneNecessary[w] = true;
                }
            }
        }
    }

    for(unsigned int i=0;i<pMesh->mNumBones;i++)    {
        if(!isBoneNecessary[i]) {
            mNumBonesCanDoWithout++;
            split = true;
        }

        mNumBones++;
    }
    return split;
}